

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937-64.c
# Opt level: O1

unsigned_long_long genrand64_int64(void)

{
  long lVar1;
  ulong uVar2;
  unsigned_long_long uVar3;
  
  if (0x137 < mti) {
    if (mti == 0x139) {
      mt[0] = 0x1571;
      lVar1 = 1;
      uVar3 = 0x1571;
      do {
        uVar3 = (uVar3 >> 0x3e ^ uVar3) * 0x5851f42d4c957f2d + lVar1;
        mt[lVar1] = uVar3;
        lVar1 = lVar1 + 1;
      } while (lVar1 != 0x138);
    }
    lVar1 = -0x9c;
    do {
      mt[lVar1 + 0x9c] =
           genrand64_int64::mag01[(uint)mt[lVar1 + 0x9d] & 1] ^ *(ulong *)(&_end + lVar1 * 8) ^
           ((ulong)((uint)mt[lVar1 + 0x9d] & 0x7ffffffe) | mt[lVar1 + 0x9c] & 0xffffffff80000000) >>
           1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0);
    lVar1 = 0;
    do {
      mt[lVar1 + 0x9c] =
           genrand64_int64::mag01[(uint)mt[lVar1 + 0x9d] & 1] ^ mt[lVar1] ^
           ((ulong)((uint)mt[lVar1 + 0x9d] & 0x7ffffffe) | mt[lVar1 + 0x9c] & 0xffffffff80000000) >>
           1;
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x9b);
    mt[0x137] = genrand64_int64::mag01[(uint)mt[0] & 1] ^ mt[0x9b] ^
                ((ulong)((uint)mt[0] & 0x7ffffffe) | mt[0x137] & 0xffffffff80000000) >> 1;
    mti = 0;
  }
  lVar1 = (long)mti;
  mti = mti + 1;
  uVar2 = mt[lVar1] >> 0x1d & 0x555555555 ^ mt[lVar1];
  uVar2 = (uVar2 & 0x38eb3ffff6d3) << 0x11 ^ uVar2;
  uVar2 = (ulong)((uint)uVar2 & 0x7ffbf77) << 0x25 ^ uVar2;
  return uVar2 >> 0x2b ^ uVar2;
}

Assistant:

unsigned long long genrand64_int64(void)
{
    int i;
    unsigned long long x;
    static unsigned long long mag01[2]={0ULL, MATRIX_A};

    if (mti >= NN) { /* generate NN words at one time */

        /* if init_genrand64() has not been called, */
        /* a default initial seed is used     */
        if (mti == NN+1) 
            init_genrand64(5489ULL); 

        for (i=0;i<NN-MM;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+MM] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        for (;i<NN-1;i++) {
            x = (mt[i]&UM)|(mt[i+1]&LM);
            mt[i] = mt[i+(MM-NN)] ^ (x>>1) ^ mag01[(int)(x&1ULL)];
        }
        x = (mt[NN-1]&UM)|(mt[0]&LM);
        mt[NN-1] = mt[MM-1] ^ (x>>1) ^ mag01[(int)(x&1ULL)];

        mti = 0;
    }
  
    x = mt[mti++];

    x ^= (x >> 29) & 0x5555555555555555ULL;
    x ^= (x << 17) & 0x71D67FFFEDA60000ULL;
    x ^= (x << 37) & 0xFFF7EEE000000000ULL;
    x ^= (x >> 43);

    return x;
}